

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall cmGlobalUnixMakefileGenerator3::Generate(cmGlobalUnixMakefileGenerator3 *this)

{
  _Rb_tree_header *p_Var1;
  pointer ppcVar2;
  cmLocalGenerator *this_00;
  pointer pcVar3;
  cmGeneratedFileStream *pcVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  string *psVar7;
  ostream *poVar8;
  iterator __end1;
  iterator __begin1;
  unsigned_long total;
  pointer ppcVar9;
  string markFileName;
  unsigned_long current;
  cmGeneratedFileStream markFile;
  string local_2a0;
  unsigned_long local_280;
  cmGeneratedFileStream local_278;
  
  cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
  p_Var1 = &(this->ProgressMap)._M_t._M_impl.super__Rb_tree_header;
  total = 0;
  p_Var6 = (this->ProgressMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var5 = p_Var6; (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    total = (long)&(p_Var5[1]._M_parent)->_M_color + total;
  }
  local_280 = 0;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      TargetProgress::WriteProgressVariables
                ((TargetProgress *)&p_Var6[1]._M_parent,total,&local_280);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  ppcVar9 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar9 != ppcVar2) {
    do {
      this_00 = *ppcVar9;
      psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      pcVar3 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a0,pcVar3,pcVar3 + psVar7->_M_string_length);
      std::__cxx11::string::append((char *)&local_2a0);
      std::__cxx11::string::append((char *)&local_2a0);
      std::__cxx11::string::append((char *)&local_2a0);
      cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&local_2a0,false,None);
      CountProgressMarksInAll(this,this_00);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&local_278);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      ppcVar9 = ppcVar9 + 1;
    } while (ppcVar9 != ppcVar2);
  }
  WriteMainMakefile2(this);
  WriteMainCMakefile(this);
  pcVar4 = this->CommandDatabase;
  if (pcVar4 != (cmGeneratedFileStream *)0x0) {
    std::ios::widen((char)(pcVar4->super_ofstream).
                          super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]
                    + (char)pcVar4);
    std::ostream::put((char)pcVar4);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
    if (this->CommandDatabase != (cmGeneratedFileStream *)0x0) {
      (*(this->CommandDatabase->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream[1])();
    }
    this->CommandDatabase = (cmGeneratedFileStream *)0x0;
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::Generate()
{
  // first do superclass method
  this->cmGlobalGenerator::Generate();

  // initialize progress
  unsigned long total = 0;
  for (auto const& pmi : this->ProgressMap) {
    total += pmi.second.NumberOfActions;
  }

  // write each target's progress.make this loop is done twice. Bascially the
  // Generate pass counts all the actions, the first loop below determines
  // how many actions have progress updates for each target and writes to
  // corrrect variable values for everything except the all targets. The
  // second loop actually writes out correct values for the all targets as
  // well. This is because the all targets require more information that is
  // computed in the first loop.
  unsigned long current = 0;
  for (auto& pmi : this->ProgressMap) {
    pmi.second.WriteProgressVariables(total, current);
  }
  for (cmLocalGenerator* lg : this->LocalGenerators) {
    std::string markFileName = lg->GetCurrentBinaryDirectory();
    markFileName += "/";
    markFileName += "/CMakeFiles";
    markFileName += "/progress.marks";
    cmGeneratedFileStream markFile(markFileName);
    markFile << this->CountProgressMarksInAll(lg) << "\n";
  }

  // write the main makefile
  this->WriteMainMakefile2();
  this->WriteMainCMakefile();

  if (this->CommandDatabase != nullptr) {
    *this->CommandDatabase << std::endl << "]";
    delete this->CommandDatabase;
    this->CommandDatabase = nullptr;
  }
}